

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O0

BlendFunc sglr::rr_util::mapGLBlendFunc(deUint32 func)

{
  undefined4 local_c;
  deUint32 func_local;
  
  if (func == 0) {
    local_c = BLENDFUNC_ZERO;
  }
  else if (func == 1) {
    local_c = BLENDFUNC_ONE;
  }
  else if (func == 0x300) {
    local_c = BLENDFUNC_SRC_COLOR;
  }
  else if (func == 0x301) {
    local_c = BLENDFUNC_ONE_MINUS_SRC_COLOR;
  }
  else if (func == 0x302) {
    local_c = BLENDFUNC_SRC_ALPHA;
  }
  else if (func == 0x303) {
    local_c = BLENDFUNC_ONE_MINUS_SRC_ALPHA;
  }
  else if (func == 0x304) {
    local_c = BLENDFUNC_DST_ALPHA;
  }
  else if (func == 0x305) {
    local_c = BLENDFUNC_ONE_MINUS_DST_ALPHA;
  }
  else if (func == 0x306) {
    local_c = BLENDFUNC_DST_COLOR;
  }
  else if (func == 0x307) {
    local_c = BLENDFUNC_ONE_MINUS_DST_COLOR;
  }
  else if (func == 0x308) {
    local_c = BLENDFUNC_SRC_ALPHA_SATURATE;
  }
  else if (func == 0x8001) {
    local_c = BLENDFUNC_CONSTANT_COLOR;
  }
  else if (func == 0x8002) {
    local_c = BLENDFUNC_ONE_MINUS_CONSTANT_COLOR;
  }
  else if (func == 0x8003) {
    local_c = BLENDFUNC_CONSTANT_ALPHA;
  }
  else if (func == 0x8004) {
    local_c = BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA;
  }
  else if (func == 0x8589) {
    local_c = BLENDFUNC_SRC1_ALPHA;
  }
  else if (func == 0x88f9) {
    local_c = BLENDFUNC_SRC1_COLOR;
  }
  else if (func == 0x88fa) {
    local_c = BLENDFUNC_ONE_MINUS_SRC1_COLOR;
  }
  else if (func == 0x88fb) {
    local_c = BLENDFUNC_ONE_MINUS_SRC1_ALPHA;
  }
  else {
    local_c = BLENDFUNC_LAST;
  }
  return local_c;
}

Assistant:

rr::BlendFunc mapGLBlendFunc (deUint32 func)
{
	switch (func)
	{
		case GL_ZERO:						return rr::BLENDFUNC_ZERO;
		case GL_ONE:						return rr::BLENDFUNC_ONE;
		case GL_SRC_COLOR:					return rr::BLENDFUNC_SRC_COLOR;
		case GL_ONE_MINUS_SRC_COLOR:		return rr::BLENDFUNC_ONE_MINUS_SRC_COLOR;
		case GL_DST_COLOR:					return rr::BLENDFUNC_DST_COLOR;
		case GL_ONE_MINUS_DST_COLOR:		return rr::BLENDFUNC_ONE_MINUS_DST_COLOR;
		case GL_SRC_ALPHA:					return rr::BLENDFUNC_SRC_ALPHA;
		case GL_ONE_MINUS_SRC_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_SRC_ALPHA;
		case GL_DST_ALPHA:					return rr::BLENDFUNC_DST_ALPHA;
		case GL_ONE_MINUS_DST_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_DST_ALPHA;
		case GL_CONSTANT_COLOR:				return rr::BLENDFUNC_CONSTANT_COLOR;
		case GL_ONE_MINUS_CONSTANT_COLOR:	return rr::BLENDFUNC_ONE_MINUS_CONSTANT_COLOR;
		case GL_CONSTANT_ALPHA:				return rr::BLENDFUNC_CONSTANT_ALPHA;
		case GL_ONE_MINUS_CONSTANT_ALPHA:	return rr::BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA;
		case GL_SRC_ALPHA_SATURATE:			return rr::BLENDFUNC_SRC_ALPHA_SATURATE;
		case GL_SRC1_COLOR:					return rr::BLENDFUNC_SRC1_COLOR;
		case GL_ONE_MINUS_SRC1_COLOR:		return rr::BLENDFUNC_ONE_MINUS_SRC1_COLOR;
		case GL_SRC1_ALPHA:					return rr::BLENDFUNC_SRC1_ALPHA;
		case GL_ONE_MINUS_SRC1_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_SRC1_ALPHA;
		default:
			DE_ASSERT(false);
			return rr::BLENDFUNC_LAST;
	}
}